

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<QRectF>>(QDataStream *s,QList<QRectF> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  parameter_type in_stack_ffffffffffffff88;
  StreamStateSaver *in_stack_ffffffffffffff90;
  QDataStream *local_40;
  QRectF local_38;
  undefined1 *local_18;
  undefined1 *local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            (in_stack_ffffffffffffff90,(QDataStream *)in_stack_ffffffffffffff88);
  QList<QRectF>::clear((QList<QRectF> *)in_stack_ffffffffffffff90);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff90);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
    local_40 = in_RDI;
  }
  else {
    QList<QRectF>::reserve((QList<QRectF> *)in_RDI,asize);
    for (in_stack_ffffffffffffff90 = (StreamStateSaver *)0x0; local_40 = in_RDI,
        (long)in_stack_ffffffffffffff90 < qVar2;
        in_stack_ffffffffffffff90 =
             (StreamStateSaver *)((long)&((DataPointer *)&in_stack_ffffffffffffff90->stream)->d + 1)
        ) {
      local_38.xp = -NAN;
      local_38.yp = -NAN;
      local_38.w = -NAN;
      local_38.h = -NAN;
      QRectF::QRectF(&local_38);
      ::operator>>(in_RDI,(QRectF *)&local_38);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 != Ok) {
        QList<QRectF>::clear((QList<QRectF> *)in_stack_ffffffffffffff90);
        local_40 = in_RDI;
        break;
      }
      QList<QRectF>::append((QList<QRectF> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == asize) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}